

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

void libaom_examples::print_multilayer_metadata(MultilayerMetadata *multilayer)

{
  size_type sVar1;
  const_reference color_properties;
  undefined8 uVar2;
  uint *in_RDI;
  pair<libaom_examples::DepthRepresentationElement,_bool> *in_stack_00000098;
  LayerMetadata *layer;
  size_t i;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  ulong local_10;
  
  printf("=== Multilayer metadata ===\n");
  printf("use_case: %d\n",(ulong)*in_RDI);
  for (local_10 = 0;
      sVar1 = std::
              vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ::size((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                      *)(in_RDI + 2)), local_10 < sVar1; local_10 = local_10 + 1) {
    color_properties =
         std::
         vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
         operator[]((vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                     *)(in_RDI + 2),local_10);
    printf("layer %zu\n",local_10);
    printf("  layer_type: %d\n",(ulong)color_properties->layer_type);
    printf("  luma_plane_only_flag: %d\n",(ulong)(color_properties->luma_plane_only_flag & 1));
    printf("  layer_view_type: %d\n",(ulong)color_properties->layer_view_type);
    printf("  group_id: %d\n",(ulong)color_properties->group_id);
    printf("  layer_dependency_idc: %d\n",(ulong)color_properties->layer_dependency_idc);
    printf("  layer_metadata_scope: %d\n",(ulong)color_properties->layer_metadata_scope);
    (anonymous_namespace)::format_color_properties_abi_cxx11_
              ((pair<libaom_examples::ColorProperties,_bool> *)color_properties);
    uVar2 = std::__cxx11::string::c_str();
    printf("  layer_color_description: %s\n",uVar2);
    std::__cxx11::string::~string(local_38);
    if (color_properties->layer_type == MULTILAYER_LAYER_TYPE_ALPHA) {
      printf("  alpha:\n");
      printf("    alpha_use_idc: %d\n",(ulong)(color_properties->global_alpha_info).alpha_use_idc);
      printf("    alpha_simple_flag: %d\n",
             (ulong)((color_properties->global_alpha_info).alpha_simple_flag & 1));
      if (((color_properties->global_alpha_info).alpha_simple_flag & 1U) == 0) {
        printf("    alpha_bit_depth: %d\n",
               (ulong)(color_properties->global_alpha_info).alpha_bit_depth);
        printf("    alpha_clip_idc: %d\n",
               (ulong)(color_properties->global_alpha_info).alpha_clip_idc);
        printf("    alpha_incr_flag: %d\n",
               (ulong)((color_properties->global_alpha_info).alpha_incr_flag & 1));
        printf("    alpha_transparent_value: %hu\n",
               (ulong)(color_properties->global_alpha_info).alpha_transparent_value);
        printf("    alpha_opaque_value: %hu\n",
               (ulong)(color_properties->global_alpha_info).alpha_opaque_value);
        (anonymous_namespace)::format_color_properties_abi_cxx11_
                  ((pair<libaom_examples::ColorProperties,_bool> *)color_properties);
        uVar2 = std::__cxx11::string::c_str();
        printf("    alpha_color_description: %s\n",uVar2);
        std::__cxx11::string::~string(local_68);
      }
    }
    else if (color_properties->layer_type == MULTILAYER_LAYER_TYPE_DEPTH) {
      printf("  depth:\n");
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_(in_stack_00000098);
      uVar2 = std::__cxx11::string::c_str();
      printf("    z_near: %s\n",uVar2);
      std::__cxx11::string::~string(local_88);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_(in_stack_00000098);
      uVar2 = std::__cxx11::string::c_str();
      printf("    z_far: %s\n",uVar2);
      std::__cxx11::string::~string(local_a8);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_(in_stack_00000098);
      uVar2 = std::__cxx11::string::c_str();
      printf("    d_min: %s\n",uVar2);
      std::__cxx11::string::~string(local_c8);
      (anonymous_namespace)::format_depth_representation_element_abi_cxx11_(in_stack_00000098);
      uVar2 = std::__cxx11::string::c_str();
      printf("    d_max: %s\n",uVar2);
      std::__cxx11::string::~string(local_e8);
      printf("    depth_representation_type: %d\n",
             (ulong)(color_properties->global_depth_info).depth_representation_type);
      printf("    disparity_ref_view_id: %d\n",
             (ulong)(color_properties->global_depth_info).disparity_ref_view_id);
      printf("\n");
    }
  }
  printf("\n");
  return;
}

Assistant:

void print_multilayer_metadata(const MultilayerMetadata &multilayer) {
  printf("=== Multilayer metadata ===\n");
  printf("use_case: %d\n", multilayer.use_case);
  for (size_t i = 0; i < multilayer.layers.size(); ++i) {
    const LayerMetadata &layer = multilayer.layers[i];
    printf("layer %zu\n", i);
    printf("  layer_type: %d\n", layer.layer_type);
    printf("  luma_plane_only_flag: %d\n", layer.luma_plane_only_flag);
    printf("  layer_view_type: %d\n", layer.layer_view_type);
    printf("  group_id: %d\n", layer.group_id);
    printf("  layer_dependency_idc: %d\n", layer.layer_dependency_idc);
    printf("  layer_metadata_scope: %d\n", layer.layer_metadata_scope);
    printf("  layer_color_description: %s\n",
           format_color_properties(layer.layer_color_description).c_str());
    if (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA) {
      printf("  alpha:\n");
      printf("    alpha_use_idc: %d\n", layer.global_alpha_info.alpha_use_idc);
      printf("    alpha_simple_flag: %d\n",
             layer.global_alpha_info.alpha_simple_flag);
      if (!layer.global_alpha_info.alpha_simple_flag) {
        printf("    alpha_bit_depth: %d\n",
               layer.global_alpha_info.alpha_bit_depth);
        printf("    alpha_clip_idc: %d\n",
               layer.global_alpha_info.alpha_clip_idc);
        printf("    alpha_incr_flag: %d\n",
               layer.global_alpha_info.alpha_incr_flag);
        printf("    alpha_transparent_value: %hu\n",
               layer.global_alpha_info.alpha_transparent_value);
        printf("    alpha_opaque_value: %hu\n",
               layer.global_alpha_info.alpha_opaque_value);
        printf("    alpha_color_description: %s\n",
               format_color_properties(
                   layer.global_alpha_info.alpha_color_description)
                   .c_str());
      }
    } else if (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH) {
      printf("  depth:\n");
      printf("    z_near: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_near)
                 .c_str());
      printf("    z_far: %s\n",
             format_depth_representation_element(layer.global_depth_info.z_far)
                 .c_str());
      printf("    d_min: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_min)
                 .c_str());
      printf("    d_max: %s\n",
             format_depth_representation_element(layer.global_depth_info.d_max)
                 .c_str());
      printf("    depth_representation_type: %d\n",
             layer.global_depth_info.depth_representation_type);
      printf("    disparity_ref_view_id: %d\n",
             layer.global_depth_info.disparity_ref_view_id);
      printf("\n");
    }
  }
  printf("\n");
}